

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O3

void __thiscall
tcpp::Preprocessor::_processElseConditional(Preprocessor *this,TIfStackEntry *currStackEntry)

{
  undefined8 uVar1;
  byte bVar2;
  TErrorInfo local_10;
  
  if (currStackEntry->mHasElseBeenFound == true) {
    local_10.mType = ANOTHER_ELSE_BLOCK_FOUND;
    local_10.mLine = this->mpLexer->mCurrLineIndex;
    if ((this->mOnErrorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar1 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar1);
    }
    (*(this->mOnErrorCallback)._M_invoker)((_Any_data *)&this->mOnErrorCallback,&local_10);
  }
  else {
    bVar2 = true;
    if (currStackEntry->mHasIfBlockBeenEntered == false) {
      bVar2 = currStackEntry->mShouldBeSkipped ^ 1;
    }
    currStackEntry->mShouldBeSkipped = (bool)bVar2;
    currStackEntry->mHasElseBeenFound = true;
  }
  return;
}

Assistant:

void Preprocessor::_processElseConditional(TIfStackEntry& currStackEntry) TCPP_NOEXCEPT
	{
		if (currStackEntry.mHasElseBeenFound)
		{
			mOnErrorCallback({ E_ERROR_TYPE::ANOTHER_ELSE_BLOCK_FOUND, mpLexer->GetCurrLineIndex() });
			return;
		}

		currStackEntry.mShouldBeSkipped  = 
			currStackEntry.mHasIfBlockBeenEntered || 
			!currStackEntry.mShouldBeSkipped;

		currStackEntry.mHasElseBeenFound = true;
	}